

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
Validator_validMathInMultipleMathMLBlocksInvalidMathTagDuplicateIDs_Test::
Validator_validMathInMultipleMathMLBlocksInvalidMathTagDuplicateIDs_Test
          (Validator_validMathInMultipleMathMLBlocksInvalidMathTagDuplicateIDs_Test *this)

{
  Validator_validMathInMultipleMathMLBlocksInvalidMathTagDuplicateIDs_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this =
       &PTR__Validator_validMathInMultipleMathMLBlocksInvalidMathTagDuplicateIDs_Test_001a2928;
  return;
}

Assistant:

TEST(Validator, validMathInMultipleMathMLBlocksInvalidMathTagDuplicateIDs)
{
    const std::string math =
        "<math xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\" xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "  <apply>\n"
        "    <eq/>\n"
        "    <ci>A</ci>\n"
        "    <apply>\n"
        "      <cn id=\"myId\" cellml:units=\"dimensionless\">1</cn>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</math>\n"
        "<banana/>\n"
        "<math xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\" xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "  <apply>\n"
        "    <eq/>\n"
        "    <ci id=\"myId\">B</ci>\n"
        "    <apply>\n"
        "      <cn cellml:units=\"dimensionless\">2</cn>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</math>\n";
    const std::vector<std::string> expectedIssues = {
        "Math root node is of invalid type 'banana' on component 'componentName'. A valid math root node should be of type 'math'.",
        "Duplicated identifier attribute 'myId' has been found in:\n"
        " - MathML cn element in math in component 'componentName'; and\n"
        " - MathML ci element 'B' in math in component 'componentName'.\n",
    };
    libcellml::ValidatorPtr v = libcellml::Validator::create();
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();

    m->setName("modelName");
    c->setName("componentName");
    v1->setName("A");
    v2->setName("B");
    v1->setUnits("dimensionless");
    v2->setUnits("dimensionless");

    c->addVariable(v1);
    c->addVariable(v2);
    c->setMath(math);
    m->addComponent(c);

    v->validateModel(m);

    EXPECT_EQ_ISSUES(expectedIssues, v);
}